

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O1

void __thiscall testing::internal::ExpectationBase::RetireAllPreRequisites(ExpectationBase *this)

{
  ExpectationBase *pEVar1;
  _Base_ptr p_Var2;
  ExpectationBase *__tmp;
  vector<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
  expectations;
  ExpectationBase *next;
  ExpectationBase **local_48;
  ExpectationBase **ppEStack_40;
  ExpectationBase **local_38;
  ExpectationBase *local_28;
  
  if (this->retired_ == false) {
    local_48 = (ExpectationBase **)0x0;
    ppEStack_40 = (ExpectationBase **)0x0;
    local_38 = (ExpectationBase **)0x0;
    local_48 = (ExpectationBase **)operator_new(8);
    ppEStack_40 = local_48 + 1;
    *local_48 = this;
    local_38 = ppEStack_40;
    if (local_48 != ppEStack_40) {
      do {
        pEVar1 = ppEStack_40[-1];
        ppEStack_40 = ppEStack_40 + -1;
        for (p_Var2 = (pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.
                      super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var2 !=
            &(pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header;
            p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
          local_28 = *(ExpectationBase **)(p_Var2 + 1);
          if (local_28->retired_ == false) {
            local_28->retired_ = true;
            if (ppEStack_40 == local_38) {
              std::
              vector<testing::internal::ExpectationBase*,std::allocator<testing::internal::ExpectationBase*>>
              ::_M_realloc_insert<testing::internal::ExpectationBase*const&>
                        ((vector<testing::internal::ExpectationBase*,std::allocator<testing::internal::ExpectationBase*>>
                          *)&local_48,(iterator)ppEStack_40,&local_28);
            }
            else {
              *ppEStack_40 = local_28;
              ppEStack_40 = ppEStack_40 + 1;
            }
          }
        }
      } while (local_48 != ppEStack_40);
    }
    if (local_48 != (ExpectationBase **)0x0) {
      operator_delete(local_48,(long)local_38 - (long)local_48);
    }
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  if (is_retired()) {
    // We can take this short-cut as we never retire an expectation
    // until we have retired all its pre-requisites.
    return;
  }

  ::std::vector<ExpectationBase*> expectations(1, this);
  while (!expectations.empty()) {
    ExpectationBase* exp = expectations.back();
    expectations.pop_back();

    for (ExpectationSet::const_iterator it =
             exp->immediate_prerequisites_.begin();
         it != exp->immediate_prerequisites_.end(); ++it) {
      ExpectationBase* next = it->expectation_base().get();
      if (!next->is_retired()) {
        next->Retire();
        expectations.push_back(next);
      }
    }
  }
}